

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O3

ngx_slab_page_t * ngx_slab_alloc_pages(ngx_slab_pool_t *pool,ngx_uint_t pages)

{
  ulong uVar1;
  uintptr_t uVar2;
  ngx_slab_page_t *pnVar3;
  ngx_slab_page_t *pnVar4;
  ngx_slab_page_t **ppnVar5;
  ngx_slab_page_t *pnVar6;
  long lVar7;
  
  pnVar3 = (pool->free).next;
  while( true ) {
    if (pnVar3 == &pool->free) {
      if ((pool->field_0x79 & 1) != 0) {
        ngx_slab_error(pool,3,"ngx_slab_alloc() failed: no memory");
      }
      return (ngx_slab_page_t *)0x0;
    }
    uVar1 = pnVar3->slab;
    if (uVar1 >= pages) break;
    pnVar3 = pnVar3->next;
  }
  if (uVar1 < pages || uVar1 - pages == 0) {
    pnVar6 = pnVar3->next;
    pnVar4 = (ngx_slab_page_t *)pnVar3->prev;
    pnVar4->next = pnVar6;
  }
  else {
    pnVar4 = pnVar3 + pages;
    pnVar3[uVar1 - 1].prev = (uintptr_t)pnVar4;
    pnVar4->slab = uVar1 - pages;
    pnVar4->next = pnVar3->next;
    uVar2 = pnVar3->prev;
    pnVar4->prev = uVar2;
    *(ngx_slab_page_t **)(uVar2 + 8) = pnVar4;
    pnVar6 = pnVar3->next;
  }
  pnVar6->prev = (uintptr_t)pnVar4;
  pnVar3->slab = pages | 0x8000000000000000;
  pnVar3->next = (ngx_slab_page_t *)0x0;
  pnVar3->prev = 0;
  pool->pfree = pool->pfree - pages;
  lVar7 = pages - 1;
  if (lVar7 == 0) {
    return pnVar3;
  }
  ppnVar5 = &pnVar3[1].next;
  do {
    ((ngx_slab_page_t *)(ppnVar5 + -1))->slab = 0xffffffffffffffff;
    *ppnVar5 = (ngx_slab_page_t *)0x0;
    ppnVar5[1] = (ngx_slab_page_t *)0x0;
    ppnVar5 = ppnVar5 + 3;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  return pnVar3;
}

Assistant:

static ngx_slab_page_t *
ngx_slab_alloc_pages(ngx_slab_pool_t *pool, ngx_uint_t pages)
{
    ngx_slab_page_t  *page, *p;

    for (page = pool->free.next; page != &pool->free; page = page->next) {

        if (page->slab >= pages) {

            if (page->slab > pages) {
                page[page->slab - 1].prev = (uintptr_t) &page[pages];

                page[pages].slab = page->slab - pages;
                page[pages].next = page->next;
                page[pages].prev = page->prev;

                p = (ngx_slab_page_t *) page->prev;
                p->next = &page[pages];
                page->next->prev = (uintptr_t) &page[pages];

            } else {
                p = (ngx_slab_page_t *) page->prev;
                p->next = page->next;
                page->next->prev = page->prev;
            }

            page->slab = pages | NGX_SLAB_PAGE_START;
            page->next = NULL;
            page->prev = NGX_SLAB_PAGE;

            pool->pfree -= pages;

            if (--pages == 0) {
                return page;
            }

            for (p = page + 1; pages; pages--) {
                p->slab = NGX_SLAB_PAGE_BUSY;
                p->next = NULL;
                p->prev = NGX_SLAB_PAGE;
                p++;
            }

            return page;
        }
    }

    if (pool->log_nomem) {
        ngx_slab_error(pool, NGX_LOG_CRIT,
                       "ngx_slab_alloc() failed: no memory");
    }

    return NULL;
}